

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

string * __thiscall
HighsMipSolverData::solutionSourceToString_abi_cxx11_
          (HighsMipSolverData *this,int solution_source,bool code)

{
  byte in_CL;
  uint in_EDX;
  string *in_RDI;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [15];
  allocator local_16;
  byte local_15;
  
  local_15 = in_CL & 1;
  if (in_EDX == 0xffffffff) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"None",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI," ",&local_16);
      std::allocator<char>::~allocator((allocator<char> *)&local_16);
    }
  }
  else if (in_EDX == 0) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Branching",&local_27);
      std::allocator<char>::~allocator((allocator<char> *)&local_27);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"B",&local_26);
      std::allocator<char>::~allocator((allocator<char> *)&local_26);
    }
  }
  else if (in_EDX == 1) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Central rounding",&local_29);
      std::allocator<char>::~allocator((allocator<char> *)&local_29);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"C",&local_28);
      std::allocator<char>::~allocator((allocator<char> *)&local_28);
    }
  }
  else if (in_EDX == 2) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Feasibility pump",&local_2b);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"F",&local_2a);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    }
  }
  else if (in_EDX == 3) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Heuristic",&local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"H",&local_2c);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    }
  }
  else if (in_EDX == 4) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Sub-MIP",&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"L",&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    }
  }
  else if (in_EDX == 5) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Empty MIP",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"P",&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_30);
    }
  }
  else if (in_EDX == 6) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Randomized rounding",&local_33);
      std::allocator<char>::~allocator((allocator<char> *)&local_33);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"R",&local_32);
      std::allocator<char>::~allocator((allocator<char> *)&local_32);
    }
  }
  else if (in_EDX == 7) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Solve LP",&local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_35);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"S",&local_34);
      std::allocator<char>::~allocator((allocator<char> *)&local_34);
    }
  }
  else if (in_EDX == 8) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Evaluate node",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"T",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
    }
  }
  else if (in_EDX == 9) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Unbounded",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"U",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
    }
  }
  else if (in_EDX == 10) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Trivial zero",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"z",&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    }
  }
  else if (in_EDX == 0xb) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Trivial lower",&local_3d);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"l",&local_3c);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    }
  }
  else if (in_EDX == 0xc) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Trivial upper",&local_3f);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"u",&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    }
  }
  else if (in_EDX == 0xd) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Trivial point",&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"p",&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_40);
    }
  }
  else if (in_EDX == 0xe) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"User solution",&local_43);
      std::allocator<char>::~allocator((allocator<char> *)&local_43);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"X",&local_42);
      std::allocator<char>::~allocator((allocator<char> *)&local_42);
    }
  }
  else if (in_EDX == 0xf) {
    if (local_15 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_45);
      std::allocator<char>::~allocator((allocator<char> *)&local_45);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI," ",&local_44);
      std::allocator<char>::~allocator((allocator<char> *)&local_44);
    }
  }
  else {
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",(ulong)in_EDX);
    if ((local_15 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"None",&local_47);
      std::allocator<char>::~allocator((allocator<char> *)&local_47);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"*",&local_46);
      std::allocator<char>::~allocator((allocator<char> *)&local_46);
    }
  }
  return in_RDI;
}

Assistant:

std::string HighsMipSolverData::solutionSourceToString(
    const int solution_source, const bool code) {
  if (solution_source == kSolutionSourceNone) {
    if (code) return " ";
    return "None";
  } else if (solution_source == kSolutionSourceBranching) {
    if (code) return "B";
    return "Branching";
  } else if (solution_source == kSolutionSourceCentralRounding) {
    if (code) return "C";
    return "Central rounding";
  } else if (solution_source == kSolutionSourceFeasibilityPump) {
    if (code) return "F";
    return "Feasibility pump";
  } else if (solution_source == kSolutionSourceHeuristic) {
    if (code) return "H";
    return "Heuristic";
    //  } else if (solution_source == kSolutionSourceInitial) {
    //    if (code) return "I";
    //    return "Initial";
  } else if (solution_source == kSolutionSourceSubMip) {
    if (code) return "L";
    return "Sub-MIP";
  } else if (solution_source == kSolutionSourceEmptyMip) {
    if (code) return "P";
    return "Empty MIP";
  } else if (solution_source == kSolutionSourceRandomizedRounding) {
    if (code) return "R";
    return "Randomized rounding";
  } else if (solution_source == kSolutionSourceSolveLp) {
    if (code) return "S";
    return "Solve LP";
  } else if (solution_source == kSolutionSourceEvaluateNode) {
    if (code) return "T";
    return "Evaluate node";
  } else if (solution_source == kSolutionSourceUnbounded) {
    if (code) return "U";
    return "Unbounded";
  } else if (solution_source == kSolutionSourceTrivialZ) {
    if (code) return "z";
    return "Trivial zero";
  } else if (solution_source == kSolutionSourceTrivialL) {
    if (code) return "l";
    return "Trivial lower";
  } else if (solution_source == kSolutionSourceTrivialU) {
    if (code) return "u";
    return "Trivial upper";
  } else if (solution_source == kSolutionSourceTrivialP) {
    if (code) return "p";
    return "Trivial point";
  } else if (solution_source == kSolutionSourceUserSolution) {
    if (code) return "X";
    return "User solution";
  } else if (solution_source == kSolutionSourceCleanup) {
    if (code) return " ";
    return "";
  } else {
    printf("HighsMipSolverData::solutionSourceToString: Unknown source = %d\n",
           solution_source);
    assert(0 == 111);
    if (code) return "*";
    return "None";
  }
}